

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::CreateInternalFluxElements(TPZMHMixedMeshControl *this)

{
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  long *plVar1;
  long subdomain;
  int64_t nelem;
  TPZGeoEl *gel;
  ulong uVar2;
  int iVar3;
  mapped_type *this_02;
  undefined1 *puVar4;
  ulong uVar5;
  TPZGeoEl **ppTVar6;
  TPZCompEl *cel;
  ulong *puVar7;
  ulong uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  TPZCompMesh *cmeshHDiv;
  TPZCompMesh *local_f8;
  undefined **local_f0;
  undefined1 *local_e8;
  ulong uStack_e0;
  ulong local_d8;
  undefined1 local_d0 [160];
  
  this_00 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
  iVar3 = this_00->fDim;
  this_01 = ((this->fFluxMesh).fRef)->fPointer;
  local_f8 = this_01;
  TPZGeoMesh::ResetReference(this_00);
  TPZCompMesh::LoadReferences(this_01);
  this_01->fDimModel = iVar3;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&this_01->fCreate,iVar3);
  this_01->fDefaultOrder = (this->super_TPZMHMeshControl).fpOrderInternal;
  this_02 = std::
            map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
            ::operator[](&(this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier,&local_f8);
  TPZManVector<long,_10>::Expand(this_02,10000);
  uVar5 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if ((this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fNElements != uVar5) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x3c7);
  }
  puVar4 = local_d0;
  local_e8 = (undefined1 *)0x0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_f0 = &PTR__TPZManVector_019e1568;
  memset(puVar4,0,0xa0);
  if ((long)uVar5 < 0xb) {
    local_e8 = puVar4;
    if ((long)uVar5 < 1) goto LAB_01449f73;
  }
  else {
    puVar4 = (undefined1 *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
    memset(puVar4,0,uVar5 << 4);
    local_d8 = uVar5;
  }
  plVar1 = (this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore;
  puVar7 = (ulong *)(puVar4 + 8);
  uVar10 = 0;
  do {
    puVar7[-1] = plVar1[uVar10];
    *puVar7 = uVar10;
    uVar10 = uVar10 + 1;
    puVar7 = puVar7 + 2;
    local_e8 = puVar4;
  } while (uVar5 != uVar10);
LAB_01449f73:
  puVar4 = local_e8;
  uStack_e0 = uVar5;
  if (uVar5 * 0x10 != 0) {
    puVar9 = local_e8 + uVar5 * 0x10;
    uVar5 = (long)puVar9 - (long)local_e8 >> 4;
    lVar11 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::__introsort_loop<std::pair<long,long>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_e8,puVar9,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<std::pair<long,long>*,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar9);
  }
  if ((long)uStack_e0 < 1) {
    lVar11 = -1;
  }
  else {
    lVar11 = -1;
    uVar10 = 0;
    uVar5 = 0xffffffffffffffff;
    do {
      subdomain = *(long *)(local_e8 + uVar10 * 0x10);
      if (subdomain != -1) {
        nelem = *(int64_t *)(local_e8 + uVar10 * 0x10 + 8);
        uVar2 = uVar5;
        if (((subdomain != lVar11) &&
            (bVar12 = lVar11 != -1, uVar2 = uVar10, lVar11 = subdomain, bVar12)) &&
           (uVar5 = (ulong)(int)uVar5, (long)uVar5 < (long)uVar10)) {
          uVar8 = uVar5 << 4 | 8;
          do {
            uVar5 = uVar5 + 1;
            ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->
                                  fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                                 *(int64_t *)(local_e8 + uVar8));
            (*ppTVar6)->fReference = (TPZCompEl *)0x0;
            uVar8 = uVar8 + 0x10;
          } while ((uVar5 & 0xffffffff) != uVar10);
        }
        uVar5 = uVar2;
        ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
        gel = *ppTVar6;
        if ((gel != (TPZGeoEl *)0x0) &&
           (iVar3 = (**(code **)(*(long *)gel + 0x1d0))(gel), iVar3 == 0)) {
          cel = TPZCreateApproximationSpace::CreateCompEl(&local_f8->fCreate,gel,local_f8);
          TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,cel,subdomain);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)uStack_e0);
    lVar11 = (long)(int)uVar5;
  }
  if (lVar11 < (long)uStack_e0) {
    uVar5 = lVar11 << 4 | 8;
    do {
      ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,*(int64_t *)(local_e8 + uVar5));
      (*ppTVar6)->fReference = (TPZCompEl *)0x0;
      lVar11 = lVar11 + 1;
      uVar5 = uVar5 + 0x10;
    } while (lVar11 < (long)uStack_e0);
  }
  (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
  local_d8 = 0;
  if ((local_e8 != local_d0) && (local_f0 = &PTR__TPZVec_019e15d0, local_e8 != (undefined1 *)0x0)) {
    operator_delete__(local_e8);
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateInternalFluxElements() {
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh *cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);

    // Create MHM computational elements
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();

    if (fGeoToMHMDomain.size() != nel) DebugStop();

    TPZManVector<std::pair<int64_t, int64_t>> MHMOfEachGeoEl(nel);
    for (int i = 0; i < nel; i++) {
        MHMOfEachGeoEl[i] = std::make_pair(fGeoToMHMDomain[i], i);
    }

    std::sort(&MHMOfEachGeoEl[0], &MHMOfEachGeoEl[nel - 1] + 1);

    int64_t previousMHMDomain = -1;
    int64_t firstElemInMHMDomain = -1;
    for (int i = 0; i < MHMOfEachGeoEl.size(); i++) {
        int64_t MHMDomain = MHMOfEachGeoEl[i].first;
        int64_t elIndex = MHMOfEachGeoEl[i].second;

        if (MHMDomain == -1) continue;

        if (MHMDomain != previousMHMDomain) {
            if (previousMHMDomain != -1) {
                for (int j = firstElemInMHMDomain; j < i; j++) {
                    fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
                }
            }
            firstElemInMHMDomain = i;
            previousMHMDomain = MHMDomain;
        }

        // Create the flux element
        TPZGeoEl *gel = fGMesh->Element(elIndex);
        if (!gel || gel->HasSubElement()) continue;
        TPZCompEl* cel = cmeshHDiv->CreateCompEl(gel);
//        TPZCompEl *cel = cmeshHDiv->Element(index);
        // Associate the connects with the subdomain for the flux mesh
        SetSubdomain(cel, MHMDomain);
    }
    // Resets references of last MHM domain
    for (int j = firstElemInMHMDomain; j < MHMOfEachGeoEl.size(); j++) {
        fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
    }

    fFluxMesh->ExpandSolution();
}